

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

void calc_sad3_update_bestmv
               (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,MV_COST_PARAMS *mv_cost_params,
               FULLPEL_MV *best_mv,FULLPEL_MV center_mv,uint8_t *center_address,uint *bestsad,
               uint *raw_bestsad,int search_step,int *best_site,int *chkpts_indices,int *cost_list)

{
  int iVar1;
  long lVar2;
  FULLPEL_MV *second_best_mv;
  undefined4 in_ECX;
  long in_RDI;
  long in_R8;
  int index_1;
  int j_1;
  int found_better_mv;
  FULLPEL_MV this_mv;
  int index;
  int j;
  uint sads [4];
  uchar *block_offset [4];
  search_site *site;
  buf_2d *ref;
  buf_2d *src;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int iVar3;
  FULLPEL_MV *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff90;
  long local_68;
  short local_4;
  short sStack_2;
  
  lVar2 = *(long *)(in_RDI + 0x50) + (long)found_better_mv * 0x88;
  local_68 = in_R8 + *(int *)(lVar2 + 4 + (long)*(int *)sads._0_8_ * 8);
  second_best_mv = (FULLPEL_MV *)(in_R8 + *(int *)(lVar2 + 4 + (long)*(int *)(sads._0_8_ + 4) * 8));
  (**(code **)(in_RDI + 0xd8))
            (**(undefined8 **)(in_RDI + 0x18),*(undefined4 *)(*(undefined8 **)(in_RDI + 0x18) + 3),
             &local_68,*(undefined4 *)(*(long *)(in_RDI + 0x10) + 0x18),&stack0xffffffffffffff88);
  for (iVar3 = 0; iVar3 < 3; iVar3 = iVar3 + 1) {
    iVar1 = *(int *)(sads._0_8_ + (long)iVar3 * 4);
    local_4 = (short)in_ECX;
    sStack_2 = (short)((uint)in_ECX >> 0x10);
    in_stack_ffffffffffffff78 =
         update_mvs_and_sad(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                            (MV_COST_PARAMS *)CONCAT44(iVar3,iVar1),
                            (uint *)CONCAT26(sStack_2 + *(short *)(lVar2 + 2 + (long)iVar1 * 8),
                                             CONCAT24(local_4 + *(short *)(lVar2 + (long)iVar1 * 8),
                                                      in_stack_ffffffffffffff78)),
                            (uint *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            (FULLPEL_MV *)0x0,second_best_mv);
    if (in_stack_ffffffffffffff78 != 0) {
      *_index = iVar3;
    }
  }
  if (sads._8_8_ != 0) {
    for (iVar3 = 0; iVar3 < 3; iVar3 = iVar3 + 1) {
      *(undefined4 *)(sads._8_8_ + (long)(*(int *)(sads._0_8_ + (long)iVar3 * 4) + 1) * 4) =
           *(undefined4 *)(&stack0xffffffffffffff88 + (long)iVar3 * 4);
    }
  }
  return;
}

Assistant:

static inline void calc_sad3_update_bestmv(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
    const MV_COST_PARAMS *mv_cost_params, FULLPEL_MV *best_mv,
    FULLPEL_MV center_mv, const uint8_t *center_address, unsigned int *bestsad,
    unsigned int *raw_bestsad, int search_step, int *best_site,
    const int *chkpts_indices, int *cost_list) {
  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const search_site *site = ms_params->search_sites->site[search_step];
  unsigned char const *block_offset[4] = {
    center_address + site[chkpts_indices[0]].offset,
    center_address + site[chkpts_indices[1]].offset,
    center_address + site[chkpts_indices[2]].offset,
    center_address,
  };
  unsigned int sads[4];
  ms_params->sdx3df(src->buf, src->stride, block_offset, ref->stride, sads);
  for (int j = 0; j < 3; j++) {
    const int index = chkpts_indices[j];
    const FULLPEL_MV this_mv = { center_mv.row + site[index].mv.row,
                                 center_mv.col + site[index].mv.col };
    const int found_better_mv = update_mvs_and_sad(
        sads[j], &this_mv, mv_cost_params, bestsad, raw_bestsad, best_mv,
        /*second_best_mv=*/NULL);
    if (found_better_mv) *best_site = j;
  }
  if (cost_list) {
    for (int j = 0; j < 3; j++) {
      int index = chkpts_indices[j];
      cost_list[index + 1] = sads[j];
    }
  }
}